

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O3

void __thiscall
r_exec::HLPOverlay::HLPOverlay(HLPOverlay *this,Controller *c,HLPBindingMap *bindings)

{
  atomic_int_fast64_t *paVar1;
  
  Overlay::Overlay(&this->super_Overlay,c,true);
  (this->super_Overlay).super__Object._vptr__Object = (_func_int **)&PTR__HLPOverlay_001c00f8;
  (this->bindings).object = (_Object *)bindings;
  if (bindings != (HLPBindingMap *)0x0) {
    LOCK();
    paVar1 = &(bindings->super_BindingMap).super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  (this->patterns).cells.
  super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->patterns).cells.
  super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->patterns).cells.
  super__Vector_base<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(this->patterns).used_cells_head = 0xffffffff;
  *(undefined4 *)((long)&(this->patterns).used_cells_head + 4) = 0xffffffff;
  *(undefined4 *)&(this->patterns).used_cells_tail = 0xffffffff;
  *(undefined4 *)((long)&(this->patterns).used_cells_tail + 4) = 0xffffffff;
  (this->patterns).free_cells = -1;
  (this->patterns).used_cell_count = 0;
  (this->patterns).free_cell_count = 0;
  return;
}

Assistant:

HLPOverlay::HLPOverlay(Controller *c, HLPBindingMap *bindings): Overlay(c, true), bindings(bindings)
{
}